

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_heap.h
# Opt level: O0

void __thiscall csbpl_common::Heap<double>::insert(Heap<double> *this,Ptr *e)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  element_type *peVar5;
  __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var6;
  reference pvVar7;
  reference this_00;
  undefined1 local_30 [8];
  Ptr temp;
  int parent;
  int i;
  Ptr *e_local;
  Heap<double> *this_local;
  
  sVar4 = std::
          vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
          ::size(&this->data_);
  peVar5 = std::
           __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)e);
  peVar5->heap_index_ = (int)sVar4;
  std::
  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ::push_back(&this->data_,e);
  iVar3 = size(this);
  temp.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = iVar3 + -1;
  temp.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ =
       getParent(this,temp.
                      super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_);
  while( true ) {
    bVar2 = false;
    if ((int)temp.
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi != -1) {
      p_Var6 = (__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                  ::operator[](&this->data_,
                               (long)temp.
                                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_);
      peVar5 = std::
               __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      dVar1 = peVar5->key_;
      p_Var6 = (__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                  ::operator[](&this->data_,
                               (long)(int)temp.
                                          super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi);
      peVar5 = std::
               __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      bVar2 = dVar1 < peVar5->key_;
    }
    if (!bVar2) break;
    pvVar7 = std::
             vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
             ::operator[](&this->data_,
                          (long)temp.
                                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi._4_4_);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::shared_ptr
              ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_30,pvVar7);
    pvVar7 = std::
             vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
             ::operator[](&this->data_,
                          (long)(int)temp.
                                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    this_00 = std::
              vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
              ::operator[](&this->data_,
                           (long)temp.
                                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::operator=(this_00,pvVar7);
    iVar3 = temp.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_;
    p_Var6 = (__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ::operator[](&this->data_,
                             (long)temp.
                                   super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_);
    peVar5 = std::
             __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var6);
    peVar5->heap_index_ = iVar3;
    pvVar7 = std::
             vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
             ::operator[](&this->data_,
                          (long)(int)temp.
                                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::operator=
              (pvVar7,(shared_ptr<csbpl_common::Heap<double>::Element> *)local_30);
    iVar3 = (int)temp.
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    p_Var6 = (__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ::operator[](&this->data_,
                             (long)(int)temp.
                                        super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
    peVar5 = std::
             __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var6);
    peVar5->heap_index_ = iVar3;
    temp.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ =
         (int)temp.
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    temp.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ =
         getParent(this,(int)temp.
                             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
              ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_30);
  }
  return;
}

Assistant:

void insert(Ptr e)
  {
    e->heap_index_ = static_cast<int>(data_.size());
    data_.push_back(e);

    // Percolate up
    int i = size() - 1;
    int parent = getParent(i);
    while (parent != -1 && data_[i]->key_ < data_[parent]->key_)
    {
      // Perform a swap
      Ptr temp = data_[i];
      data_[i] = data_[parent];
      data_[i]->heap_index_ = i;
      data_[parent] = temp;
      data_[parent]->heap_index_ = parent;
      // Continue to percolate up the tree
      i = parent;
      parent = getParent(parent);
    }
  }